

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_syntax.hpp
# Opt level: O1

size_t jessilib::fail_action<char8_t,jessilib::json_context<char8_t,true>,true>
                 (decode_result param_1,json_context<char8_t,_true> *param_2,
                 basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_read_view)

{
  undefined1 auVar1 [16];
  decode_result dVar2;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  string local_70;
  char32_t local_50 [2];
  char8_t *local_48;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_40;
  undefined8 local_30;
  char8_t *local_28;
  
  auVar1 = __cxa_allocate_exception(0x10,param_1.units);
  in_string._M_str = auVar1._8_8_;
  local_30 = 0x27;
  local_28 = "Invalid parse data; unexpected token: \'";
  in_string._M_len = (size_t)in_read_view->_M_str;
  dVar2 = decode_codepoint_utf8<char8_t>((jessilib *)in_read_view->_M_len,in_string);
  local_40._M_str = (char8_t *)dVar2.units;
  local_40._M_len._0_4_ = dVar2.codepoint;
  local_50[0] = L'\x13';
  local_50[1] = L'\0';
  local_48 = "\' when parsing data";
  join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            (&local_70,(jessilib *)&local_30,&local_40,local_50,&local_40);
  std::invalid_argument::invalid_argument(auVar1._0_8_,(string *)&local_70);
  __cxa_throw(auVar1._0_8_,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
             );
}

Assistant:

size_t fail_action(decode_result, ContextT&, std::basic_string_view<CharT>& in_read_view) {
	using namespace std::literals;
	if constexpr (UseExceptionsV) {
		throw std::invalid_argument{ jessilib::join_mbstring(u8"Invalid parse data; unexpected token: '"sv,
			jessilib::decode_codepoint(in_read_view).codepoint,
			u8"' when parsing data"sv) };
	}
	return std::numeric_limits<size_t>::max();
}